

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O1

void Gia_ManPrintFlopClasses(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  pVVar2 = p->vFlopClasses;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    return;
  }
  uVar1 = pVVar2->nSize;
  if (uVar1 == p->nRegs) {
    iVar3 = 0;
    iVar4 = 0;
    if (0 < (int)uVar1) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (uint)(pVVar2->pArray[uVar5] == 0);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    if (0 < (int)uVar1) {
      uVar5 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)(pVVar2->pArray[uVar5] == 1);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    printf("Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ",
           ((double)iVar3 * 100.0) / (double)(iVar3 + iVar4 + 1));
    if (iVar3 + iVar4 < p->nRegs) {
      printf("and there are other FF classes...");
    }
    putchar(10);
    return;
  }
  puts("Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops."
      );
  return;
}

Assistant:

void Gia_ManPrintFlopClasses( Gia_Man_t * p )
{
    int Counter0, Counter1;
    if ( p->vFlopClasses == NULL )
        return;
    if ( Vec_IntSize(p->vFlopClasses) != Gia_ManRegNum(p) )
    {
        printf( "Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops.\n" );
        return;
    }
    Counter0 = Vec_IntCountEntry( p->vFlopClasses, 0 );
    Counter1 = Vec_IntCountEntry( p->vFlopClasses, 1 );
    printf( "Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ", 
        Counter0, Counter1, 100.0*Counter1/(Counter0 + Counter1 + 1) );
    if ( Counter0 + Counter1 < Gia_ManRegNum(p) )
        printf( "and there are other FF classes..." );
    printf( "\n" );
}